

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMergeEngineLevel0(SortSubtask *pTask,int nPMA,i64 *piOffset,MergeEngine **ppOut)

{
  long lVar1;
  SQLiteThread *pFile;
  SortSubtask *in_RCX;
  i64 *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  PmaReader *pReadr;
  int rc;
  int i;
  i64 iOff;
  MergeEngine *pNew;
  i64 nDummy;
  PmaReader *in_stack_ffffffffffffffb0;
  int iVar2;
  int iVar3;
  i64 iStart;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iStart = *in_RDX;
  iVar2 = 0;
  pFile = (SQLiteThread *)vdbeMergeEngineNew((int)((ulong)iStart >> 0x20));
  in_RCX->pThread = pFile;
  if (pFile == (SQLiteThread *)0x0) {
    iVar2 = 7;
  }
  for (iVar3 = 0; iVar3 < in_ESI && iVar2 == 0; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffb0 = (PmaReader *)pFile->xTask + iVar3;
    iVar2 = vdbePmaReaderInit(in_RCX,(SorterFile *)pFile,iStart,(PmaReader *)CONCAT44(iVar3,iVar2),
                              &in_stack_ffffffffffffffb0->iReadOff);
    iStart = in_stack_ffffffffffffffb0->iEof;
  }
  if (iVar2 != 0) {
    vdbeMergeEngineFree((MergeEngine *)in_stack_ffffffffffffffb0);
    in_RCX->pThread = (SQLiteThread *)0x0;
  }
  *in_RDX = iStart;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbeMergeEngineLevel0(
  SortSubtask *pTask,             /* Sorter task to read from */
  int nPMA,                       /* Number of PMAs to read */
  i64 *piOffset,                  /* IN/OUT: Readr offset in pTask->file */
  MergeEngine **ppOut             /* OUT: New merge-engine */
){
  MergeEngine *pNew;              /* Merge engine to return */
  i64 iOff = *piOffset;
  int i;
  int rc = SQLITE_OK;

  *ppOut = pNew = vdbeMergeEngineNew(nPMA);
  if( pNew==0 ) rc = SQLITE_NOMEM_BKPT;

  for(i=0; i<nPMA && rc==SQLITE_OK; i++){
    i64 nDummy = 0;
    PmaReader *pReadr = &pNew->aReadr[i];
    rc = vdbePmaReaderInit(pTask, &pTask->file, iOff, pReadr, &nDummy);
    iOff = pReadr->iEof;
  }

  if( rc!=SQLITE_OK ){
    vdbeMergeEngineFree(pNew);
    *ppOut = 0;
  }
  *piOffset = iOff;
  return rc;
}